

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::F_formatter<spdlog::details::null_scoped_padder>::format
          (F_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  duration duration;
  ulong uVar7;
  ulong uVar8;
  byte abStack_2a [5];
  undefined2 local_25;
  char local_23 [3];
  char *local_20;
  
  uVar7 = (msg->time).__d.__r % 1000000000;
  lVar3 = 0x3f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar4 = (uint)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::bsr2log10[lVar3] -
          (uint)(uVar7 < *(ulong *)(fmt::v10::detail::do_count_digits(unsigned_long)::
                                    zero_or_powers_of_10 +
                                   (ulong)(byte)fmt::v10::detail::do_count_digits(unsigned_long)::
                                                bsr2log10[lVar3] * 8));
  if (uVar4 < 9) {
    iVar5 = 9 - uVar4;
    do {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar1 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar1 + 1;
      (dest->super_buffer<char>).ptr_[sVar1] = '0';
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  pcVar6 = local_23;
  uVar8 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar8 / 100;
      *(undefined2 *)(pcVar6 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (uVar8 % 100) * 2);
      pcVar6 = pcVar6 + -2;
      bVar2 = 9999 < uVar8;
      uVar8 = uVar7;
    } while (bVar2);
  }
  if (uVar7 < 10) {
    pcVar6[-1] = (byte)uVar7 | 0x30;
    local_20 = pcVar6 + -1;
  }
  else {
    *(undefined2 *)(pcVar6 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + uVar7 * 2);
    local_20 = pcVar6 + -2;
  }
  fmt::v10::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }